

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXAnimation.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::AnimationStack::AnimationStack
          (AnimationStack *this,uint64_t id,Element *element,string *name,Document *doc)

{
  Connection *this_00;
  Scope *sc;
  Object *pOVar1;
  element_type *peVar2;
  allocator<char> local_81;
  AnimationLayerList *local_80;
  _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  local_78;
  AnimationLayer *anim;
  AnimationStack *local_58;
  string local_50;
  
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__AnimationStack_007f1b18;
  local_80 = &this->layers;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->layers).
  super__Vector_base<const_Assimp::FBX::AnimationLayer_*,_std::allocator<const_Assimp::FBX::AnimationLayer_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->layers).
  super__Vector_base<const_Assimp::FBX::AnimationLayer_*,_std::allocator<const_Assimp::FBX::AnimationLayer_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->layers).
  super__Vector_base<const_Assimp::FBX::AnimationLayer_*,_std::allocator<const_Assimp::FBX::AnimationLayer_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = this;
  sc = GetRequiredScope(element);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"AnimationStack.FbxAnimStack",(allocator<char> *)&anim);
  Util::GetPropertyTable((Util *)&local_78,doc,&local_50,element,sc,true);
  std::__shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->props).
              super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2> *)&local_78
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_78._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)&local_50);
  Document::GetConnectionsByDestinationSequenced
            ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)&local_78,doc,(this->super_Object).id,"AnimationLayer");
  std::
  vector<const_Assimp::FBX::AnimationLayer_*,_std::allocator<const_Assimp::FBX::AnimationLayer_*>_>
  ::reserve(local_80,(long)local_78._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_78._M_impl.super__Vector_impl_data._M_start >> 3);
  peVar2 = (element_type *)local_78._M_impl.super__Vector_impl_data._M_start;
  do {
    if (peVar2 == (element_type *)local_78._M_impl.super__Vector_impl_data._M_finish) {
      std::
      _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ::~_Vector_base(&local_78);
      return;
    }
    this_00 = *(Connection **)&(peVar2->lazyProps)._M_t._M_impl;
    if ((this_00->prop)._M_string_length == 0) {
      pOVar1 = Connection::SourceObject(this_00);
      if (pOVar1 == (Object *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,
                   "failed to read source object for AnimationLayer->AnimationStack link, ignoring",
                   (allocator<char> *)&anim);
        Util::DOMWarning(&local_50,element);
      }
      else {
        anim = (AnimationLayer *)
               __dynamic_cast(pOVar1,&Object::typeinfo,&AnimationLayer::typeinfo,0);
        if (anim != (AnimationLayer *)0x0) {
          std::
          vector<const_Assimp::FBX::AnimationLayer_*,_std::allocator<const_Assimp::FBX::AnimationLayer_*>_>
          ::push_back(local_80,(value_type *)&anim);
          goto LAB_004ba4c4;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,
                   "source object for ->AnimationStack link is not an AnimationLayer",&local_81);
        Util::DOMWarning(&local_50,element);
      }
      std::__cxx11::string::~string((string *)&local_50);
    }
LAB_004ba4c4:
    peVar2 = (element_type *)&(peVar2->lazyProps)._M_t._M_impl.super__Rb_tree_header;
  } while( true );
}

Assistant:

AnimationStack::AnimationStack(uint64_t id, const Element& element, const std::string& name, const Document& doc)
: Object(id, element, name)
{
    const Scope& sc = GetRequiredScope(element);

    // note: we don't currently use any of these properties so we shouldn't bother if it is missing
    props = GetPropertyTable(doc,"AnimationStack.FbxAnimStack",element,sc, true);

    // resolve attached animation layers
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID(),"AnimationLayer");
    layers.reserve(conns.size());

    for(const Connection* con : conns) {

        // link should not go to a property
        if (con->PropertyName().length()) {
            continue;
        }

        const Object* const ob = con->SourceObject();
        if(!ob) {
            DOMWarning("failed to read source object for AnimationLayer->AnimationStack link, ignoring",&element);
            continue;
        }

        const AnimationLayer* const anim = dynamic_cast<const AnimationLayer*>(ob);
        if(!anim) {
            DOMWarning("source object for ->AnimationStack link is not an AnimationLayer",&element);
            continue;
        }
        layers.push_back(anim);
    }
}